

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenTupleMake(BinaryenModuleRef module,BinaryenExpressionRef *operands,BinaryenIndex numOperands
                 )

{
  size_t i;
  ulong uVar1;
  TupleMake *pTVar2;
  Builder local_40;
  undefined1 auStack_38 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> ops;
  
  auStack_38 = (undefined1  [8])0x0;
  ops.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ops.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::resize
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_38,
             (ulong)numOperands);
  for (uVar1 = 0; numOperands != uVar1; uVar1 = uVar1 + 1) {
    *(BinaryenExpressionRef *)((long)auStack_38 + uVar1 * 8) = operands[uVar1];
  }
  local_40.wasm = module;
  pTVar2 = wasm::Builder::
           makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&>
                     (&local_40,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_38)
  ;
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_38);
  return (BinaryenExpressionRef)pTVar2;
}

Assistant:

BinaryenExpressionRef BinaryenTupleMake(BinaryenModuleRef module,
                                        BinaryenExpressionRef* operands,
                                        BinaryenIndex numOperands) {
  std::vector<Expression*> ops;
  ops.resize(numOperands);
  for (size_t i = 0; i < numOperands; ++i) {
    ops[i] = (Expression*)operands[i];
  }
  return static_cast<Expression*>(Builder(*(Module*)module).makeTupleMake(ops));
}